

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v11::detail::do_format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  int iVar1;
  detail *pdVar2;
  size_t value_00;
  char *pcVar3;
  int in_ECX;
  undefined4 in_register_00000014;
  undefined1 auVar4 [16];
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  make_unsigned_t<int> local_7c;
  uint n;
  char cStack_58;
  int size_local;
  unsigned___int128 value_local;
  char *out_local;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,size);
  auVar4._8_8_ = in_stack_ffffffffffffff60;
  auVar4._0_8_ = in_stack_ffffffffffffff58;
  iVar1 = count_digits((detail *)out,(uint128_opt)auVar4);
  if (iVar1 <= in_ECX) {
    local_7c = to_unsigned<int>(in_ECX);
    _cStack_58 = out;
    while ((_cStack_58 < (char *)0x64) <= (ulong)value_local) {
      local_7c = local_7c - 2;
      pdVar2 = this + local_7c;
      value_00 = __umodti3(_cStack_58,(ulong)value_local);
      pcVar3 = digits2(value_00);
      *(undefined2 *)pdVar2 = *(undefined2 *)pcVar3;
      auVar4 = __udivti3(_cStack_58,(ulong)value_local,100,0);
      value_local._0_8_ = auVar4._8_8_;
      _cStack_58 = auVar4._0_8_;
    }
    if ((ulong)value_local < (_cStack_58 < (char *)0xa)) {
      local_7c = local_7c - 1;
      this[local_7c] = (detail)(cStack_58 + '0');
    }
    else {
      local_7c = local_7c - 2;
      pdVar2 = this + local_7c;
      pcVar3 = digits2((ulong)_cStack_58 & 0xffffffff);
      *(undefined2 *)pdVar2 = *(undefined2 *)pcVar3;
    }
    return (char *)(this + local_7c);
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format.h"
              ,0x49d,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}